

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_deriveBlockSplitsHelper
               (seqStoreSplits *splits,size_t startIdx,size_t endIdx,ZSTD_CCtx *zc,
               seqStore_t *origSeqStore)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong endIdx_00;
  seqStore_t secondHalfSeqStore;
  seqStore_t firstHalfSeqStore;
  seqStore_t fullSeqStoreChunk;
  seqStore_t local_120;
  seqStore_t local_d0;
  seqStore_t local_80;
  
  while( true ) {
    if ((endIdx - startIdx < 300) || (0xc3 < splits->idx)) {
      return;
    }
    endIdx_00 = endIdx + startIdx >> 1;
    ZSTD_deriveSeqStoreChunk(&local_80,origSeqStore,startIdx,endIdx);
    ZSTD_deriveSeqStoreChunk(&local_d0,origSeqStore,startIdx,endIdx_00);
    ZSTD_deriveSeqStoreChunk(&local_120,origSeqStore,endIdx_00,endIdx);
    sVar1 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&local_80,zc);
    sVar2 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&local_d0,zc);
    sVar3 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&local_120,zc);
    if (0xffffffffffffff88 < sVar2 || 0xffffffffffffff88 < sVar1) {
      return;
    }
    if (sVar1 <= sVar2 + sVar3 || 0xffffffffffffff88 < sVar3) break;
    ZSTD_deriveBlockSplitsHelper(splits,startIdx,endIdx_00,zc,origSeqStore);
    sVar1 = splits->idx;
    splits->splitLocations[sVar1] = (U32)endIdx_00;
    splits->idx = sVar1 + 1;
    startIdx = endIdx_00;
  }
  return;
}

Assistant:

static void ZSTD_deriveBlockSplitsHelper(seqStoreSplits* splits, size_t startIdx, size_t endIdx,
                                         const ZSTD_CCtx* zc, const seqStore_t* origSeqStore) {
    seqStore_t fullSeqStoreChunk;
    seqStore_t firstHalfSeqStore;
    seqStore_t secondHalfSeqStore;
    size_t estimatedOriginalSize;
    size_t estimatedFirstHalfSize;
    size_t estimatedSecondHalfSize;
    size_t midIdx = (startIdx + endIdx)/2;

    if (endIdx - startIdx < MIN_SEQUENCES_BLOCK_SPLITTING || splits->idx >= MAX_NB_SPLITS) {
        return;
    }
    ZSTD_deriveSeqStoreChunk(&fullSeqStoreChunk, origSeqStore, startIdx, endIdx);
    ZSTD_deriveSeqStoreChunk(&firstHalfSeqStore, origSeqStore, startIdx, midIdx);
    ZSTD_deriveSeqStoreChunk(&secondHalfSeqStore, origSeqStore, midIdx, endIdx);
    estimatedOriginalSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&fullSeqStoreChunk, zc);
    estimatedFirstHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&firstHalfSeqStore, zc);
    estimatedSecondHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&secondHalfSeqStore, zc);
    DEBUGLOG(5, "Estimated original block size: %zu -- First half split: %zu -- Second half split: %zu",
             estimatedOriginalSize, estimatedFirstHalfSize, estimatedSecondHalfSize);
    if (ZSTD_isError(estimatedOriginalSize) || ZSTD_isError(estimatedFirstHalfSize) || ZSTD_isError(estimatedSecondHalfSize)) {
        return;
    }
    if (estimatedFirstHalfSize + estimatedSecondHalfSize < estimatedOriginalSize) {
        ZSTD_deriveBlockSplitsHelper(splits, startIdx, midIdx, zc, origSeqStore);
        splits->splitLocations[splits->idx] = (U32)midIdx;
        splits->idx++;
        ZSTD_deriveBlockSplitsHelper(splits, midIdx, endIdx, zc, origSeqStore);
    }
}